

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O1

char * __thiscall
sentencepiece::SelfTestData_Sample::_InternalParse
          (SelfTestData_Sample *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  bool bVar2;
  char cVar3;
  string *s;
  uint res;
  void *pvVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  byte *pbVar5;
  ArenaStringPtr *pAVar6;
  pair<const_char_*,_unsigned_int> pVar7;
  byte *local_40;
  InternalMetadata *local_38;
  
  local_38 = &(this->super_MessageLite)._internal_metadata_;
  local_40 = (byte *)ptr;
  do {
    bVar2 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                      (&ctx->super_EpsCopyInputStream,(char **)&local_40,ctx->group_depth_);
    if (bVar2) {
      return (char *)local_40;
    }
    bVar1 = *local_40;
    res = (uint)bVar1;
    pbVar5 = local_40 + 1;
    if ((char)bVar1 < '\0') {
      res = ((uint)bVar1 + (uint)*pbVar5 * 0x80) - 0x80;
      if ((char)*pbVar5 < '\0') {
        pVar7 = google::protobuf::internal::ReadTagFallback((char *)local_40,res);
        pbVar5 = (byte *)pVar7.first;
        res = pVar7.second;
      }
      else {
        pbVar5 = local_40 + 2;
      }
    }
    local_40 = pbVar5;
    if (pbVar5 == (byte *)0x0) {
      cVar3 = '\x04';
    }
    else {
      if (res >> 3 == 2) {
        if ((char)res != '\x12') goto LAB_001b84fd;
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
        pvVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
        pAVar6 = &this->expected_;
        if (((ulong)pvVar4 & 1) != 0) {
          pvVar4 = *(void **)((ulong)pvVar4 & 0xfffffffffffffffe);
        }
LAB_001b84e6:
        s = google::protobuf::internal::ArenaStringPtr::Mutable_abi_cxx11_(pAVar6,pvVar4);
        local_40 = (byte *)google::protobuf::internal::InlineGreedyStringParser
                                     (s,(char *)local_40,ctx);
      }
      else {
        if ((res >> 3 == 1) && ((char)res == '\n')) {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
          pvVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
          pAVar6 = &this->input_;
          if (((ulong)pvVar4 & 1) != 0) {
            pvVar4 = *(void **)((ulong)pvVar4 & 0xfffffffffffffffe);
          }
          goto LAB_001b84e6;
        }
LAB_001b84fd:
        if (res == 0 || (res & 7) == 4) {
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = res - 1;
          cVar3 = '\a';
          goto LAB_001b8556;
        }
        if (((ulong)local_38->ptr_ & 1) == 0) {
          unknown = google::protobuf::internal::InternalMetadata::
                    mutable_unknown_fields_slow<std::__cxx11::string>(local_38);
        }
        else {
          unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (((ulong)local_38->ptr_ & 0xfffffffffffffffe) + 8);
        }
        local_40 = (byte *)google::protobuf::internal::UnknownFieldParse
                                     (res,unknown,(char *)local_40,ctx);
      }
      cVar3 = (local_40 == (byte *)0x0) * '\x02' + '\x02';
    }
LAB_001b8556:
    if (cVar3 != '\x02') {
      if (cVar3 == '\x04') {
        local_40 = (byte *)0x0;
      }
      return (char *)local_40;
    }
  } while( true );
}

Assistant:

const char* SelfTestData_Sample::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string input = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          auto str = _internal_mutable_input();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string expected = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          auto str = _internal_mutable_expected();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<std::string>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}